

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defines.cpp
# Opt level: O0

void __thiscall vera::HaveDefines::addDefine(HaveDefines *this,string *_define,vec4 _v)

{
  int in_R8D;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *_define_local;
  HaveDefines *this_local;
  vec4 _v_local;
  
  _v_local._0_8_ = _v._8_8_;
  this_local = _v._0_8_;
  local_28 = _define;
  _define_local = (string *)this;
  toString_abi_cxx11_(&local_88,(vera *)&this_local,(vec4 *)0x2c,'\x03',in_R8D);
  std::operator+(&local_68,"vec4(",&local_88);
  std::operator+(&local_48,&local_68,")");
  (*this->_vptr_HaveDefines[10])(this,_define,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void HaveDefines::addDefine( const std::string &_define, glm::vec4 _v ) {
    addDefine(_define, "vec4(" + toString(_v, ',') + ")");
}